

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall
leveldb::DBTest_CustomComparator_Test::TestBody()::NumberComparator::FindShortestSeparator(std::
__cxx11::string*,leveldb::Slice_const___const(void *this,string *s,Slice *l)

{
  Slice local_30;
  Slice *local_20;
  Slice *l_local;
  string *s_local;
  NumberComparator *this_local;
  
  local_20 = l;
  l_local = (Slice *)s;
  s_local = (string *)this;
  Slice::Slice(&local_30,s);
  ToNumber(leveldb::Slice_const__(&local_30);
  ToNumber(leveldb::Slice_const__(local_20);
  return;
}

Assistant:

void FindShortestSeparator(std::string* s, const Slice& l) const override {
      ToNumber(*s);  // Check format
      ToNumber(l);   // Check format
    }